

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O0

pair<QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>::iterator,_bool>
* __thiscall
QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
::try_emplace<>(QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
                *this,int *key)

{
  iterator it_00;
  iterator it_01;
  bool bVar1;
  int *__y;
  QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL> *this_00;
  int *in_RDX;
  less<int> *in_RSI;
  pair<QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>::iterator,_bool>
  *in_RDI;
  long in_FS_OFFSET;
  iterator it;
  containers *in_stack_ffffffffffffff58;
  QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
  *in_stack_ffffffffffffff68;
  pair<QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>::iterator,_bool>
  *this_01;
  bool local_71;
  bool local_5a;
  bool local_59;
  containers *local_58;
  size_type local_50;
  iterator local_48;
  containers *local_38;
  size_type local_30;
  iterator local_28;
  iterator local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.i = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  local_18.c = (containers *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  local_18 = lower_bound((QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
                          *)in_RDI,(int *)in_RDI);
  local_28 = end(in_stack_ffffffffffffff68);
  bVar1 = iterator::operator==(&local_18,&local_28);
  local_71 = true;
  if (!bVar1) {
    __y = iterator::key((iterator *)0x40abf5);
    local_71 = std::less<int>::operator()(in_RSI,in_RDX,__y);
  }
  if (local_71 == false) {
    local_5a = false;
    std::
    pair<QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>::iterator,_bool>
    ::
    pair<QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>::iterator_&,_bool,_true>
              (in_RDI,&local_18,&local_5a);
  }
  else {
    this_00 = (QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL> *)(in_RSI + 0x68);
    local_38 = local_18.c;
    local_30 = local_18.i;
    it_00.i = (size_type)this_00;
    it_00.c = in_stack_ffffffffffffff58;
    toValuesIterator((QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
                      *)0x40ac52,it_00);
    QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>::emplace<>
              (this_00,(const_iterator)in_stack_ffffffffffffff58);
    local_58 = local_18.c;
    local_50 = local_18.i;
    it_01.i = (size_type)this_00;
    it_01.c = in_stack_ffffffffffffff58;
    toKeysIterator((QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
                    *)0x40ac8d,it_01);
    QVarLengthArray<int,_20LL>::insert
              ((QVarLengthArray<int,_20LL> *)this_00,(const_iterator)in_stack_ffffffffffffff58,
               (int *)0x40ac9f);
    local_48 = fromKeysIterator((QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
                                 *)this_01,(iterator)in_RDI);
    local_59 = true;
    std::
    pair<QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>::iterator,_bool>
    ::
    pair<QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>::iterator,_bool,_true>
              (in_RDI,&local_48,&local_59);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<iterator, bool> try_emplace(const Key &key, Args&&...args)
    {
        auto it = lower_bound(key);
        if (it == end() || key_compare::operator()(key, it.key())) {
            c.values.emplace(toValuesIterator(it), std::forward<Args>(args)...);
            return { fromKeysIterator(c.keys.insert(toKeysIterator(it), key)), true };
        } else {
            return {it, false};
        }
    }